

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string> * __thiscall
lest::make_enum_string<nonstd::expected_lite::unexpected_type<int>>
          (ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string>
           *__return_storage_ptr__,lest *this,unexpected_type<int> *item)

{
  ulong uVar1;
  size_type sVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong *local_c8;
  ulong local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  unexpected_type<int> *local_a0;
  ulong local_98;
  long lStack_90;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"[type: ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_98 = *puVar6;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar6;
    local_a8 = (ulong *)*plVar3;
  }
  local_a0 = (unexpected_type<int> *)plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  make_memory_string<nonstd::expected_lite::unexpected_type<int>>(&local_88,this,local_a0);
  uVar1 = (long)&local_a0->m_error + local_88._M_string_length;
  uVar7 = 0xf;
  if (local_a8 != &local_98) {
    uVar7 = local_98;
  }
  if (uVar7 < uVar1) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar8 = local_88.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00206b22;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
LAB_00206b22:
  local_c8 = &local_b8;
  puVar6 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar6) {
    local_b8 = *puVar6;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *puVar6;
    local_c8 = (ulong *)*puVar4;
  }
  sVar2 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)puVar6 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_c8 == &local_b8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_b0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8;
  }
  __return_storage_ptr__->_M_string_length = sVar2;
  local_b8 = local_b8 & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}